

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTreeEdge.cpp
# Opt level: O2

shared_ptr<Bipartition> __thiscall PhyloTreeEdge::getOriginalEdge(PhyloTreeEdge *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<Bipartition> sVar1;
  
  std::__shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x30));
  sVar1.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_Bipartition;
  return (shared_ptr<Bipartition>)sVar1.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

const shared_ptr<Bipartition> PhyloTreeEdge::getOriginalEdge() {
    return originalEdge;
}